

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86IntelInstPrinter.c
# Opt level: O3

void printopaquemem(MCInst *MI,uint OpNo,SStream *O)

{
  cs_mode cVar1;
  uint8_t uVar2;
  
  SStream_concat0(O,"ptr ");
  cVar1 = MI->csh->mode;
  if (cVar1 == CS_MODE_16) {
    uVar2 = '\x02';
  }
  else if (cVar1 == CS_MODE_64) {
    uVar2 = '\b';
  }
  else {
    if (cVar1 != CS_MODE_32) goto LAB_001a3afc;
    uVar2 = '\x04';
  }
  MI->x86opsize = uVar2;
LAB_001a3afc:
  printMemReference(MI,OpNo,O);
  return;
}

Assistant:

static void printopaquemem(MCInst *MI, unsigned OpNo, SStream *O)
{
	SStream_concat0(O, "ptr ");

	switch(MI->csh->mode) {
		case CS_MODE_16:
			MI->x86opsize = 2;
			break;
		case CS_MODE_32:
			MI->x86opsize = 4;
			break;
		case CS_MODE_64:
			MI->x86opsize = 8;
			break;
		default:	// never reach
			break;
	}

	printMemReference(MI, OpNo, O);
}